

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalSet,std::__cxx11::string&,duckdb::Value&,duckdb::SetScope&,unsigned_long&>
          (PhysicalPlan *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,Value *args_1,
          SetScope *args_2,unsigned_long *args_3)

{
  PhysicalSet *this_00;
  reference_wrapper<duckdb::PhysicalOperator> local_78;
  Value local_70;
  
  this_00 = (PhysicalSet *)ArenaAllocator::AllocateAligned(&this->arena,0xe8);
  Value::Value(&local_70,args_1);
  PhysicalSet::PhysicalSet(this_00,args,&local_70,*args_2,*args_3);
  Value::~Value(&local_70);
  local_78._M_data = (PhysicalOperator *)this_00;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&this->ops,&local_78);
  return &this_00->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}